

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O2

UINT8 __thiscall DROPlayer::GetSongInfo(DROPlayer *this,PLR_SONG_INFO *songInf)

{
  UINT16 UVar1;
  UINT32 UVar2;
  
  if (this->_dLoad != (DATA_LOADER *)0x0) {
    songInf->format = 0x44524f00;
    UVar1 = (this->_fileHdr).verMinor;
    songInf->fileVerMaj = (this->_fileHdr).verMajor;
    songInf->fileVerMin = UVar1;
    songInf->tickRateMul = 1;
    songInf->tickRateDiv = this->_tickFreq;
    UVar2 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x1c])();
    songInf->songLen = UVar2;
    songInf->loopTick = 0xffffffff;
    songInf->volGain = 0x10000;
    songInf->deviceCnt =
         *(int *)&(this->_devTypes).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
         *(int *)&(this->_devTypes).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    return '\0';
  }
  return 0xff;
}

Assistant:

UINT8 DROPlayer::GetSongInfo(PLR_SONG_INFO& songInf)
{
	if (_dLoad == NULL)
		return 0xFF;
	
	songInf.format = FCC_DRO;
	songInf.fileVerMaj = _fileHdr.verMajor;
	songInf.fileVerMin = _fileHdr.verMinor;
	songInf.tickRateMul = 1;
	songInf.tickRateDiv = _tickFreq;
	songInf.songLen = GetTotalTicks();
	songInf.loopTick = (UINT32)-1;
	songInf.volGain = 0x10000;
	songInf.deviceCnt = (UINT32)_devTypes.size();
	
	return 0x00;
}